

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawShader::FBarShader::FBarShader(FBarShader *this,bool vertical,bool reverse)

{
  WORD WVar1;
  WORD WVar2;
  int local_18;
  int i;
  bool reverse_local;
  bool vertical_local;
  FBarShader *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FBarShader_00b86138;
  WVar1 = 2;
  WVar2 = 0x100;
  if (vertical) {
    WVar2 = 2;
  }
  (this->super_FTexture).Width = WVar2;
  if (vertical) {
    WVar1 = 0x100;
  }
  (this->super_FTexture).Height = WVar1;
  FTexture::CalcBitSize(&this->super_FTexture);
  if (vertical) {
    if (reverse) {
      for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
        this->Pixels[local_18] = 0xff - (char)local_18;
        this->Pixels[local_18 + 0x100] = 0xff - (char)local_18;
      }
    }
    else {
      for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
        this->Pixels[local_18] = (BYTE)local_18;
        this->Pixels[local_18 + 0x100] = (BYTE)local_18;
      }
    }
  }
  else if (reverse) {
    for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
      this->Pixels[local_18 << 1] = (BYTE)local_18;
      this->Pixels[local_18 * 2 + 1] = (BYTE)local_18;
    }
  }
  else {
    for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
      this->Pixels[local_18 << 1] = 0xff - (char)local_18;
      this->Pixels[local_18 * 2 + 1] = 0xff - (char)local_18;
    }
  }
  this->DummySpan[0].TopOffset = 0;
  WVar1 = 2;
  if (vertical) {
    WVar1 = 0x100;
  }
  this->DummySpan[0].Length = WVar1;
  this->DummySpan[1].TopOffset = 0;
  this->DummySpan[1].Length = 0;
  return;
}

Assistant:

FBarShader(bool vertical, bool reverse)
			{
				int i;

				Width = vertical ? 2 : 256;
				Height = vertical ? 256 : 2;
				CalcBitSize();

				// Fill the column/row with shading values.
				// Vertical shaders have have minimum alpha at the top
				// and maximum alpha at the bottom, unless flipped by
				// setting reverse to true. Horizontal shaders are just
				// the opposite.
				if (vertical)
				{
					if (!reverse)
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i] = i;
							Pixels[256+i] = i;
						}
					}
					else
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i] = 255 - i;
							Pixels[256+i] = 255 -i;
						}
					}
				}
				else
				{
					if (!reverse)
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i*2] = 255 - i;
							Pixels[i*2+1] = 255 - i;
						}
					}
					else
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i*2] = i;
							Pixels[i*2+1] = i;
						}
					}
				}
				DummySpan[0].TopOffset = 0;
				DummySpan[0].Length = vertical ? 256 : 2;
				DummySpan[1].TopOffset = 0;
				DummySpan[1].Length = 0;
			}